

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,target_ulong_conflict addr,uint16_t idxmap)

{
  undefined4 *puVar1;
  CPUArchState_conflict30 *env;
  long lVar2;
  long *plVar3;
  undefined6 in_register_00000012;
  ulong uVar4;
  long lVar5;
  uint32_t *puVar6;
  timeval tv;
  timeval local_40;
  
  env = (CPUArchState_conflict30 *)cpu->env_ptr;
  puVar6 = env[-3].gpr_d + 2;
  lVar5 = 0;
  do {
    if (((uint)CONCAT62(in_register_00000012,idxmap) >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      lVar2 = lVar5 * 0x2b0;
      if ((*(uint *)((long)env + lVar2 + -0x84c) & addr) == *(uint *)((long)env + lVar2 + -0x850)) {
        gettimeofday(&local_40,(__timezone_ptr_t)0x0);
        tlb_flush_one_mmuidx_locked
                  (env,(uint)lVar5,local_40.tv_usec * 1000 + local_40.tv_sec * 1000000000);
      }
      else {
        uVar4 = (ulong)((env->gpr_a[lVar5 * 4 + -0x10] >> 6 & addr >> 0xe) << 6);
        puVar1 = (undefined4 *)(*(long *)(env->gpr_a + lVar5 * 4 + -0xe) + uVar4);
        if ((((*(uint *)(*(long *)(env->gpr_a + lVar5 * 4 + -0xe) + uVar4) & 0xffffe000) == addr) ||
            ((puVar1[1] & 0xffffe000) == addr)) || ((puVar1[2] & 0xffffe000) == addr)) {
          puVar1[0xc] = 0xffffffff;
          puVar1[0xd] = 0xffffffff;
          puVar1[0xe] = 0xffffffff;
          puVar1[0xf] = 0xffffffff;
          puVar1[8] = 0xffffffff;
          puVar1[9] = 0xffffffff;
          puVar1[10] = 0xffffffff;
          puVar1[0xb] = 0xffffffff;
          puVar1[4] = 0xffffffff;
          puVar1[5] = 0xffffffff;
          puVar1[6] = 0xffffffff;
          puVar1[7] = 0xffffffff;
          *puVar1 = 0xffffffff;
          puVar1[1] = 0xffffffff;
          puVar1[2] = 0xffffffff;
          puVar1[3] = 0xffffffff;
          plVar3 = (long *)((long)env + lVar2 + -0x838);
          *plVar3 = *plVar3 + -1;
        }
        plVar3 = (long *)((long)env + lVar2 + -0x838);
        lVar2 = 0;
        do {
          if ((((*(uint *)((long)puVar6 + lVar2) & 0xffffe000) == addr) ||
              ((*(uint *)((long)puVar6 + lVar2 + 4) & 0xffffe000) == addr)) ||
             ((*(uint *)((long)puVar6 + lVar2 + 8) & 0xffffe000) == addr)) {
            puVar1 = (undefined4 *)((long)puVar6 + lVar2);
            puVar1[0xc] = 0xffffffff;
            puVar1[0xd] = 0xffffffff;
            puVar1[0xe] = 0xffffffff;
            puVar1[0xf] = 0xffffffff;
            puVar1[8] = 0xffffffff;
            puVar1[9] = 0xffffffff;
            puVar1[10] = 0xffffffff;
            puVar1[0xb] = 0xffffffff;
            puVar1[4] = 0xffffffff;
            puVar1[5] = 0xffffffff;
            puVar1[6] = 0xffffffff;
            puVar1[7] = 0xffffffff;
            *puVar1 = 0xffffffff;
            puVar1[1] = 0xffffffff;
            puVar1[2] = 0xffffffff;
            puVar1[3] = 0xffffffff;
            *plVar3 = *plVar3 + -1;
          }
          lVar2 = lVar2 + 0x40;
        } while (lVar2 != 0x200);
      }
    }
    lVar5 = lVar5 + 1;
    puVar6 = puVar6 + 0xac;
  } while (lVar5 != 3);
  tb_flush_jmp_cache_tricore(cpu,addr);
  return;
}

Assistant:

static void tlb_flush_page_by_mmuidx_async_0(CPUState *cpu,
                                             target_ulong addr,
                                             uint16_t idxmap)
{
    CPUArchState *env = cpu->env_ptr;
    int mmu_idx;

    for (mmu_idx = 0; mmu_idx < NB_MMU_MODES; mmu_idx++) {
        if ((idxmap >> mmu_idx) & 1) {
            tlb_flush_page_locked(env, mmu_idx, addr);
        }
    }

    tb_flush_jmp_cache(cpu, addr);
}